

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Hash_Blake2s_Simd128.c
# Opt level: O0

Hacl_Hash_Blake2s_Simd128_state_t *
Hacl_Hash_Blake2s_Simd128_copy(Hacl_Hash_Blake2s_Simd128_state_t *state)

{
  Lib_IntVector_Intrinsics_vec128 *__dest;
  void *__s;
  Lib_IntVector_Intrinsics_vec128 *__s_00;
  Hacl_Hash_Blake2s_Simd128_state_t *__dest_00;
  Hacl_Hash_Blake2s_Simd128_state_t *p;
  Hacl_Hash_Blake2s_Simd128_state_t s;
  Lib_IntVector_Intrinsics_vec128 *dst_b;
  Lib_IntVector_Intrinsics_vec128 *src_b;
  Hacl_Hash_Blake2s_Simd128_block_state_t block_state;
  Lib_IntVector_Intrinsics_vec128 *b;
  Lib_IntVector_Intrinsics_vec128 *wv;
  uint8_t *buf;
  Hacl_Hash_Blake2b_index i;
  uint8_t kk1;
  uint8_t nn;
  uint64_t total_len0;
  uint8_t *buf0;
  Hacl_Hash_Blake2s_Simd128_block_state_t block_state0;
  Hacl_Hash_Blake2s_Simd128_state_t scrut;
  Hacl_Hash_Blake2s_Simd128_state_t *state_local;
  
  memcpy(&block_state0.thd.snd,state,0x28);
  block_state0.thd.fst = scrut.block_state.thd.fst;
  __dest = (Lib_IntVector_Intrinsics_vec128 *)calloc(0x40,1);
  memcpy(__dest,scrut.block_state.thd.snd,0x40);
  __s = (void *)aligned_alloc(0x10);
  memset(__s,0,0x40);
  __s_00 = (Lib_IntVector_Intrinsics_vec128 *)aligned_alloc(0x10);
  memset(__s_00,0,0x40);
  s.total_len = (uint64_t)__s_00;
  memcpy(__s_00,block_state0.thd.fst,0x40);
  p = (Hacl_Hash_Blake2s_Simd128_state_t *)CONCAT62(src_b._2_6_,block_state0.thd.snd._0_2_);
  s.block_state._0_8_ = __s;
  s.block_state.thd.fst = __s_00;
  s.block_state.thd.snd = __dest;
  __dest_00 = (Hacl_Hash_Blake2s_Simd128_state_t *)malloc(0x28);
  memcpy(__dest_00,&p,0x28);
  return __dest_00;
}

Assistant:

Hacl_Hash_Blake2s_Simd128_state_t
*Hacl_Hash_Blake2s_Simd128_copy(Hacl_Hash_Blake2s_Simd128_state_t *state)
{
  Hacl_Hash_Blake2s_Simd128_state_t scrut = *state;
  Hacl_Hash_Blake2s_Simd128_block_state_t block_state0 = scrut.block_state;
  uint8_t *buf0 = scrut.buf;
  uint64_t total_len0 = scrut.total_len;
  uint8_t nn = block_state0.snd;
  uint8_t kk1 = block_state0.fst;
  Hacl_Hash_Blake2b_index i = { .key_length = kk1, .digest_length = nn };
  uint8_t *buf = (uint8_t *)KRML_HOST_CALLOC(64U, sizeof (uint8_t));
  memcpy(buf, buf0, 64U * sizeof (uint8_t));
  Lib_IntVector_Intrinsics_vec128
  *wv =
    (Lib_IntVector_Intrinsics_vec128 *)KRML_ALIGNED_MALLOC(16,
      sizeof (Lib_IntVector_Intrinsics_vec128) * 4U);
  memset(wv, 0U, 4U * sizeof (Lib_IntVector_Intrinsics_vec128));
  Lib_IntVector_Intrinsics_vec128
  *b =
    (Lib_IntVector_Intrinsics_vec128 *)KRML_ALIGNED_MALLOC(16,
      sizeof (Lib_IntVector_Intrinsics_vec128) * 4U);
  memset(b, 0U, 4U * sizeof (Lib_IntVector_Intrinsics_vec128));
  Hacl_Hash_Blake2s_Simd128_block_state_t
  block_state = { .fst = i.key_length, .snd = i.digest_length, .thd = { .fst = wv, .snd = b } };
  Lib_IntVector_Intrinsics_vec128 *src_b = block_state0.thd.snd;
  Lib_IntVector_Intrinsics_vec128 *dst_b = block_state.thd.snd;
  memcpy(dst_b, src_b, 4U * sizeof (Lib_IntVector_Intrinsics_vec128));
  Hacl_Hash_Blake2s_Simd128_state_t
  s = { .block_state = block_state, .buf = buf, .total_len = total_len0 };
  Hacl_Hash_Blake2s_Simd128_state_t
  *p =
    (Hacl_Hash_Blake2s_Simd128_state_t *)KRML_HOST_MALLOC(sizeof (
        Hacl_Hash_Blake2s_Simd128_state_t
      ));
  p[0U] = s;
  return p;
}